

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cjson_add.c
# Opt level: O1

void cjson_add_true_should_add_true(void)

{
  cJSON *object;
  cJSON *pcVar1;
  
  object = (cJSON *)(*global_hooks.allocate)(0x40);
  if (object != (cJSON *)0x0) {
    object->child = (cJSON *)0x0;
    *(undefined8 *)&object->type = 0;
    object->valuedouble = 0.0;
    object->string = (char *)0x0;
    object->valuestring = (char *)0x0;
    *(undefined8 *)&object->valueint = 0;
    object->next = (cJSON *)0x0;
    object->prev = (cJSON *)0x0;
    object->type = 0x40;
  }
  cJSON_AddTrueToObject(object,"true");
  pcVar1 = get_object_item(object,"true",1);
  if (pcVar1 == (cJSON *)0x0) {
    UnityFail(" Expected Non-NULL",0x5b);
  }
  UnityAssertEqualNumber((long)pcVar1->type,2,(char *)0x0,0x5c,UNITY_DISPLAY_STYLE_INT);
  cJSON_Delete(object);
  return;
}

Assistant:

static void cjson_add_true_should_add_true(void)
{
    cJSON *root = cJSON_CreateObject();
    cJSON *true_item = NULL;

    cJSON_AddTrueToObject(root, "true");

    TEST_ASSERT_NOT_NULL(true_item = cJSON_GetObjectItemCaseSensitive(root, "true"));
    TEST_ASSERT_EQUAL_INT(true_item->type, cJSON_True);

    cJSON_Delete(root);
}